

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

iterator * __thiscall Catch::clara::TextFlow::Column::iterator::operator++(iterator *this)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  string *psVar4;
  char *pcVar5;
  size_t sVar6;
  size_type sVar7;
  iterator *in_RDI;
  iterator *unaff_retaddr;
  char c;
  
  in_RDI->m_pos = in_RDI->m_len + in_RDI->m_pos;
  uVar1 = in_RDI->m_pos;
  line_abi_cxx11_((iterator *)0x29608d);
  uVar3 = ::std::__cxx11::string::size();
  if (uVar1 < uVar3) {
    psVar4 = line_abi_cxx11_((iterator *)0x2960ac);
    pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)psVar4);
    if (*pcVar5 == '\n') {
      in_RDI->m_pos = in_RDI->m_pos + 1;
      goto LAB_0029614e;
    }
  }
  while( true ) {
    uVar1 = in_RDI->m_pos;
    line_abi_cxx11_((iterator *)0x2960ed);
    uVar3 = ::std::__cxx11::string::size();
    c = false;
    if (uVar1 < uVar3) {
      psVar4 = line_abi_cxx11_((iterator *)0x296112);
      ::std::__cxx11::string::operator[]((ulong)psVar4);
      c = isWhitespace(c);
    }
    if ((bool)c == false) break;
    in_RDI->m_pos = in_RDI->m_pos + 1;
  }
LAB_0029614e:
  sVar2 = in_RDI->m_pos;
  line_abi_cxx11_((iterator *)0x296161);
  sVar6 = ::std::__cxx11::string::size();
  if (sVar2 == sVar6) {
    in_RDI->m_pos = 0;
    in_RDI->m_stringIndex = in_RDI->m_stringIndex + 1;
  }
  uVar1 = in_RDI->m_stringIndex;
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&in_RDI->m_column->m_strings);
  if (uVar1 < sVar7) {
    calcLength(unaff_retaddr);
  }
  return in_RDI;
}

Assistant:

auto operator ++() -> iterator& {
			m_pos += m_len;
			if (m_pos < line().size() && line()[m_pos] == '\n')
				m_pos += 1;
			else
				while (m_pos < line().size() && isWhitespace(line()[m_pos]))
					++m_pos;

			if (m_pos == line().size()) {
				m_pos = 0;
				++m_stringIndex;
			}
			if (m_stringIndex < m_column.m_strings.size())
				calcLength();
			return *this;
		}